

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int64_t archive_read_format_rar_seek_data(archive_read *a,int64_t offset,int whence)

{
  uint *puVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  rar *rar;
  archive_read *paStack_38;
  uint i;
  int64_t ret;
  int64_t client_offset;
  int whence_local;
  int64_t offset_local;
  archive_read *a_local;
  
  puVar1 = (uint *)a->format->data;
  if (*(char *)((long)puVar1 + 0x17) != '0') {
    archive_set_error(&a->archive,-1,"Seeking of compressed RAR files is unsupported");
    return -0x19;
  }
  if (whence != 0) {
    if (whence == 1) {
      ret = *(int64_t *)(puVar1 + 0x32);
      goto LAB_0096891f;
    }
    if (whence == 2) {
      ret = *(int64_t *)(puVar1 + 10);
      goto LAB_0096891f;
    }
  }
  ret = 0;
LAB_0096891f:
  ret = offset + ret;
  if (ret < 0) {
    return -1;
  }
  if (*(long *)(puVar1 + 10) < ret) {
    *(int64_t *)(puVar1 + 0x32) = ret;
    ret = *(int64_t *)(puVar1 + 10);
  }
  ret = *(long *)(*(long *)(puVar1 + 0x40) + 8) + ret;
  rar._4_4_ = 0;
  while (rar._4_4_ < puVar1[0x42]) {
    ret = (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)(rar._4_4_ + 1) * 0x18 + 8) -
          *(long *)(*(long *)(puVar1 + 0x40) + (ulong)rar._4_4_ * 0x18 + 0x10)) + ret;
    rar._4_4_ = rar._4_4_ + 1;
  }
  if ((*puVar1 & 1) != 0) {
    do {
      while ((*(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 8) <= ret ||
             ((puVar1[6] & 1) == 0))) {
        if ((ret <= *(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 0x10)) ||
           ((puVar1[6] & 2) == 0)) goto LAB_00968dad;
        puVar1[0x42] = puVar1[0x42] + 1;
        if ((puVar1[0x42] < puVar1[0x43]) &&
           (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 0x10) < ret)) {
          ret = (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 8) -
                *(long *)(*(long *)(puVar1 + 0x40) + (ulong)(puVar1[0x42] - 1) * 0x18 + 0x10)) + ret
          ;
        }
        else {
          puVar1[0x42] = puVar1[0x42] - 1;
          iVar3 = __archive_read_seek(a,*(int64_t *)
                                         (*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 +
                                         0x10),0);
          if (iVar3 < 0) {
            return iVar3;
          }
          iVar2 = archive_read_format_rar_read_header(a,a->entry);
          if (iVar2 == 1) {
            *(undefined1 *)(puVar1 + 0x3f) = 1;
            iVar2 = archive_read_format_rar_read_header(a,a->entry);
          }
          if (iVar2 != 0) {
            archive_set_error(&a->archive,-1,"Error during seek of RAR file");
            return -0x19;
          }
          ret = (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 8) -
                *(long *)(*(long *)(puVar1 + 0x40) + (ulong)(puVar1[0x42] - 1) * 0x18 + 0x10)) + ret
          ;
        }
      }
      if (puVar1[0x42] == 0) {
        archive_set_error(&a->archive,-1,"Attempt to seek past beginning of RAR data block");
        return -0x19;
      }
      puVar1[0x42] = puVar1[0x42] - 1;
      ret = ret - (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)(puVar1[0x42] + 1) * 0x18 + 8) -
                  *(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 0x10));
    } while (ret < *(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 8));
    iVar3 = __archive_read_seek(a,*(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 +
                                           8) -
                                  *(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18),0
                               );
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar2 = archive_read_format_rar_read_header(a,a->entry);
    if (iVar2 != 0) {
      archive_set_error(&a->archive,-1,"Error during seek of RAR file");
      return -0x19;
    }
    puVar1[0x42] = puVar1[0x42] - 1;
  }
LAB_00968dad:
  paStack_38 = (archive_read *)__archive_read_seek(a,ret,0);
  a_local = paStack_38;
  if (-1 < (long)paStack_38) {
    *(long *)(puVar1 + 0x2a) =
         *(long *)(*(long *)(puVar1 + 0x40) + (ulong)puVar1[0x42] * 0x18 + 0x10) - (long)paStack_38;
    rar._4_4_ = puVar1[0x42];
    while (rar._4_4_ != 0) {
      paStack_38 = (archive_read *)
                   ((long)paStack_38 -
                   (*(long *)(*(long *)(puVar1 + 0x40) + (ulong)rar._4_4_ * 0x18 + 8) -
                   *(long *)(*(long *)(puVar1 + 0x40) + (ulong)(rar._4_4_ - 1) * 0x18 + 0x10)));
      rar._4_4_ = rar._4_4_ - 1;
    }
    lVar4 = (long)paStack_38 - *(long *)(*(long *)(puVar1 + 0x40) + 8);
    __archive_reset_read_data(&a->archive);
    puVar1[0x28] = 0;
    puVar1[0x29] = 0;
    puVar1[0x2e] = 0;
    puVar1[0x2f] = 0;
    if ((lVar4 == *(long *)(puVar1 + 10)) && (*(long *)(puVar1 + 10) < *(long *)(puVar1 + 0x32))) {
      a_local = *(archive_read **)(puVar1 + 0x32);
    }
    else {
      *(long *)(puVar1 + 0x32) = lVar4;
      a_local = *(archive_read **)(puVar1 + 0x32);
    }
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
archive_read_format_rar_seek_data(struct archive_read *a, int64_t offset,
    int whence)
{
  int64_t client_offset, ret;
  unsigned int i;
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->compression_method == COMPRESS_METHOD_STORE)
  {
    /* Modify the offset for use with SEEK_SET */
    switch (whence)
    {
      case SEEK_CUR:
        client_offset = rar->offset_seek;
        break;
      case SEEK_END:
        client_offset = rar->unp_size;
        break;
      case SEEK_SET:
      default:
        client_offset = 0;
    }
    client_offset += offset;
    if (client_offset < 0)
    {
      /* Can't seek past beginning of data block */
      return -1;
    }
    else if (client_offset > rar->unp_size)
    {
      /*
       * Set the returned offset but only seek to the end of
       * the data block.
       */
      rar->offset_seek = client_offset;
      client_offset = rar->unp_size;
    }

    client_offset += rar->dbo[0].start_offset;
    i = 0;
    while (i < rar->cursor)
    {
      i++;
      client_offset += rar->dbo[i].start_offset - rar->dbo[i-1].end_offset;
    }
    if (rar->main_flags & MHD_VOLUME)
    {
      /* Find the appropriate offset among the multivolume archive */
      while (1)
      {
        if (client_offset < rar->dbo[rar->cursor].start_offset &&
          rar->file_flags & FHD_SPLIT_BEFORE)
        {
          /* Search backwards for the correct data block */
          if (rar->cursor == 0)
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Attempt to seek past beginning of RAR data block");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          client_offset -= rar->dbo[rar->cursor+1].start_offset -
            rar->dbo[rar->cursor].end_offset;
          if (client_offset < rar->dbo[rar->cursor].start_offset)
            continue;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor].header_size, SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          break;
        }
        else if (client_offset > rar->dbo[rar->cursor].end_offset &&
          rar->file_flags & FHD_SPLIT_AFTER)
        {
          /* Search forward for the correct data block */
          rar->cursor++;
          if (rar->cursor < rar->nodes &&
            client_offset > rar->dbo[rar->cursor].end_offset)
          {
            client_offset += rar->dbo[rar->cursor].start_offset -
              rar->dbo[rar->cursor-1].end_offset;
            continue;
          }
          rar->cursor--;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].end_offset,
                                    SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret == (ARCHIVE_EOF))
          {
            rar->has_endarc_header = 1;
            ret = archive_read_format_rar_read_header(a, a->entry);
          }
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          client_offset += rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor-1].end_offset;
          continue;
        }
        break;
      }
    }

    ret = __archive_read_seek(a, client_offset, SEEK_SET);
    if (ret < (ARCHIVE_OK))
      return ret;
    rar->bytes_remaining = rar->dbo[rar->cursor].end_offset - ret;
    i = rar->cursor;
    while (i > 0)
    {
      i--;
      ret -= rar->dbo[i+1].start_offset - rar->dbo[i].end_offset;
    }
    ret -= rar->dbo[0].start_offset;

    /* Always restart reading the file after a seek */
    __archive_reset_read_data(&a->archive);

    rar->bytes_unconsumed = 0;
    rar->offset = 0;

    /*
     * If a seek past the end of file was requested, return the requested
     * offset.
     */
    if (ret == rar->unp_size && rar->offset_seek > rar->unp_size)
      return rar->offset_seek;

    /* Return the new offset */
    rar->offset_seek = ret;
    return rar->offset_seek;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
      "Seeking of compressed RAR files is unsupported");
  }
  return (ARCHIVE_FAILED);
}